

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GetConfigAttribSimpleCase::checkAttribute
          (GetConfigAttribSimpleCase *this,EGLenum attrib,EGLint value)

{
  switch(attrib) {
  case 0x3033:
    checkSurfaceTypeMask(this,value);
    return;
  case 0x3034:
    checkTransparentType(this,value);
    return;
  case 0x3035:
  case 0x3036:
  case 0x3037:
  case 0x3038:
  case 0x303b:
  case 0x303c:
  case 0x303d:
  case 0x303e:
  case 0x3041:
    goto switchD_00e5d5a3_caseD_3035;
  case 0x3039:
  case 0x303a:
switchD_00e5d5a3_caseD_3039:
    checkBoolean(this,attrib,value);
    return;
  case 0x303f:
    checkColorBufferType(this,value);
    return;
  case 0x3040:
  case 0x3042:
    return;
  default:
    if (attrib == 0x3027) {
      checkCaveat(this,value);
      return;
    }
    if (attrib == 0x302d) goto switchD_00e5d5a3_caseD_3039;
switchD_00e5d5a3_caseD_3035:
    checkInteger(this,attrib,value);
    return;
  }
}

Assistant:

void checkAttribute (EGLenum attrib, EGLint value)
	{
		switch (attrib)
		{
			case EGL_COLOR_BUFFER_TYPE:
				checkColorBufferType(value);
				break;
			case EGL_CONFIG_CAVEAT:
				checkCaveat(value);
				break;
			case EGL_TRANSPARENT_TYPE:
				checkTransparentType(value);
				break;
			case EGL_CONFORMANT:
			case EGL_RENDERABLE_TYPE:
				// Just print what we know
				break;
			case EGL_SURFACE_TYPE:
				checkSurfaceTypeMask(value);
				break;
			case EGL_BIND_TO_TEXTURE_RGB:
			case EGL_BIND_TO_TEXTURE_RGBA:
			case EGL_NATIVE_RENDERABLE:
				checkBoolean(attrib, value);
				break;
			default:
				checkInteger(attrib, value);
		}
	}